

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseCodeMetadataAnnotation(WastParser *this,ExprList *exprs)

{
  Result RVar1;
  Enum EVar2;
  pointer *__ptr;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  undefined1 local_a8 [16];
  string data_text;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Token tk;
  
  Consume(&tk,this);
  sVar3 = Token::text(&tk);
  local_a8._8_8_ = sVar3._M_str + 0xe;
  local_a8._0_8_ = sVar3._M_len - 0xe;
  data_text._M_dataplus._M_p = (pointer)&data_text.field_2;
  data_text._M_string_length = 0;
  data_text.field_2._M_local_buf[0] = '\0';
  RVar1 = ParseQuotedText(this,&data_text,false);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,
               data_text._M_dataplus._M_p,data_text._M_dataplus._M_p + data_text._M_string_length);
    std::
    make_unique<wabt::CodeMetadataExpr,std::basic_string_view<char,std::char_traits<char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
    local_b8._M_str = (char *)local_b8._M_len;
    local_b8._M_len = 0;
    intrusive_list<wabt::Expr>::push_back
              (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_b8._M_str);
    if ((long *)local_b8._M_str != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_str + 8))();
    }
    local_b8._M_str = (char *)0x0;
    if ((long *)local_b8._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_len + 8))();
    }
    RVar1 = Expect(this,Rpar);
    EVar2 = (Enum)(RVar1.enum_ == Error);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::__cxx11::string::_M_dispose();
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseCodeMetadataAnnotation(ExprList* exprs) {
  WABT_TRACE(ParseCodeMetadataAnnotation);
  Token tk = Consume();
  std::string_view name = tk.text();
  name.remove_prefix(sizeof("metadata.code.") - 1);
  std::string data_text;
  CHECK_RESULT(ParseQuotedText(&data_text, false));
  std::vector<uint8_t> data(data_text.begin(), data_text.end());
  exprs->push_back(std::make_unique<CodeMetadataExpr>(name, std::move(data)));
  EXPECT(Rpar);
  return Result::Ok;
}